

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,SocketError error)

{
  QDebug *this;
  undefined4 in_EDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  QDebugStateSaver saver;
  Stream *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  this = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(this);
  switch(in_EDX) {
  case 0:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 1:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 2:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 3:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 4:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 5:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 6:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 7:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 8:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 9:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 10:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 0xb:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 0xc:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  default:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    QDebug::operator<<((QDebug *)this_00,(int)((ulong)in_RDI >> 0x20));
    QDebug::operator<<((QDebug *)this_00,(char)((ulong)in_RDI >> 0x38));
    break;
  case 0xe:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 0xf:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 0x10:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 0x11:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 0x12:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
    break;
  case 0xffffffff:
    QDebug::operator<<((QDebug *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_stack_00000008);
  }
  QDebug::QDebug((QDebug *)this_00,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this_00;
  }
  __stack_chk_fail();
}

Assistant:

Q_NETWORK_EXPORT QDebug operator<<(QDebug debug, QAbstractSocket::SocketError error)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (error) {
    case QAbstractSocket::ConnectionRefusedError:
        debug << "QAbstractSocket::ConnectionRefusedError";
        break;
    case QAbstractSocket::RemoteHostClosedError:
        debug << "QAbstractSocket::RemoteHostClosedError";
        break;
    case QAbstractSocket::HostNotFoundError:
        debug << "QAbstractSocket::HostNotFoundError";
        break;
    case QAbstractSocket::SocketAccessError:
        debug << "QAbstractSocket::SocketAccessError";
        break;
    case QAbstractSocket::SocketResourceError:
        debug << "QAbstractSocket::SocketResourceError";
        break;
    case QAbstractSocket::SocketTimeoutError:
        debug << "QAbstractSocket::SocketTimeoutError";
        break;
    case QAbstractSocket::DatagramTooLargeError:
        debug << "QAbstractSocket::DatagramTooLargeError";
        break;
    case QAbstractSocket::NetworkError:
        debug << "QAbstractSocket::NetworkError";
        break;
    case QAbstractSocket::AddressInUseError:
        debug << "QAbstractSocket::AddressInUseError";
        break;
    case QAbstractSocket::SocketAddressNotAvailableError:
        debug << "QAbstractSocket::SocketAddressNotAvailableError";
        break;
    case QAbstractSocket::UnsupportedSocketOperationError:
        debug << "QAbstractSocket::UnsupportedSocketOperationError";
        break;
    case QAbstractSocket::UnfinishedSocketOperationError:
        debug << "QAbstractSocket::UnfinishedSocketOperationError";
        break;
    case QAbstractSocket::ProxyAuthenticationRequiredError:
        debug << "QAbstractSocket::ProxyAuthenticationRequiredError";
        break;
    case QAbstractSocket::UnknownSocketError:
        debug << "QAbstractSocket::UnknownSocketError";
        break;
    case QAbstractSocket::ProxyConnectionRefusedError:
        debug << "QAbstractSocket::ProxyConnectionRefusedError";
        break;
    case QAbstractSocket::ProxyConnectionClosedError:
        debug << "QAbstractSocket::ProxyConnectionClosedError";
        break;
    case QAbstractSocket::ProxyConnectionTimeoutError:
        debug << "QAbstractSocket::ProxyConnectionTimeoutError";
        break;
    case QAbstractSocket::ProxyNotFoundError:
        debug << "QAbstractSocket::ProxyNotFoundError";
        break;
    case QAbstractSocket::ProxyProtocolError:
        debug << "QAbstractSocket::ProxyProtocolError";
        break;
    default:
        debug << "QAbstractSocket::SocketError(" << int(error) << ')';
        break;
    }
    return debug;
}